

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::RecordSet::Decode(RecordSet *this,KDataStream *stream)

{
  pointer *ppuVar1;
  undefined2 uVar2;
  pointer puVar3;
  iterator __position;
  KUINT16 KVar4;
  KException *this_00;
  ushort uVar5;
  KUINT8 ui8Val;
  KString local_48;
  
  KVar4 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar4) {
    puVar3 = (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RecID);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RecSetSerialNum);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16RecLen);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16RecCnt);
    uVar2 = this->m_ui16RecLen;
    local_48._M_dataplus._M_p = local_48._M_dataplus._M_p & 0xffffffffffffff00;
    uVar5 = uVar2 + 0xf4 & 0xff;
    if (uVar5 != 0) {
      do {
        KDataStream::Read(stream,(KUOCTET *)&local_48);
        __position._M_current =
             (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vui8RecVals,
                     __position,(uchar *)&local_48);
        }
        else {
          *__position._M_current = (uchar)local_48._M_dataplus._M_p;
          ppuVar1 = &(this->m_vui8RecVals).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Decode","");
  KException::KException(this_00,&local_48,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void RecordSet::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RECORD_SET_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui8RecVals.clear();

    stream >> m_ui32RecID
           >> m_ui32RecSetSerialNum
           >> m_ui16RecLen
           >> m_ui16RecCnt;

    KUINT8 ui8LenOfRecVal = m_ui16RecLen - RECORD_SET_SIZE;

    KUINT8 ui8Val = 0;

    // This data also includes any padding that may exist.
    for( KUINT8 i = 0; i < ui8LenOfRecVal; ++i )
    {
        stream >> ui8Val;
        m_vui8RecVals.push_back( ui8Val );
    }
}